

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *ms;
  seqStore_t *origSeqStore;
  U32 *pUVar1;
  seqStore_t *resultSeqStore;
  seqStore_t *resultSeqStore_00;
  undefined8 uVar2;
  undefined8 uVar3;
  BYTE BVar4;
  U32 UVar5;
  ZSTD_paramSwitch_e ZVar6;
  ZSTD_strategy ZVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  ZSTD_compressedBlockState_t *pZVar10;
  seqDef *psVar11;
  ushort uVar12;
  ulong uVar13;
  size_t sVar14;
  U32 UVar15;
  int iVar16;
  int iVar17;
  size_t err_code;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  unsigned_long_long uVar21;
  byte bVar22;
  short sVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  BYTE *pBVar29;
  ulong uVar30;
  seqStore_t *psVar31;
  ulong uVar32;
  seqStore_t *psVar33;
  BYTE *ip;
  long lVar34;
  long lVar35;
  size_t err_code_1;
  ulong uVar36;
  bool bVar37;
  byte bVar38;
  undefined1 auVar39 [16];
  ulong local_120;
  BYTE *op;
  size_t local_110;
  repcodes_t dRep;
  undefined4 uStack_e4;
  BYTE *local_78;
  BYTE *local_70;
  size_t local_68;
  long local_60;
  repcodes_t local_58;
  size_t local_48;
  ZSTD_cwksp *local_40;
  BYTE *local_38;
  
  bVar38 = 0;
  if (cctx->stage == ZSTDcs_created) {
    local_110 = 0xffffffffffffffc4;
  }
  else {
    if (cctx->stage == ZSTDcs_init && frame != 0) {
      sVar18 = ZSTD_writeFrameHeader
                         (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                          cctx->dictID);
      if (0xffffffffffffff88 < sVar18) {
        return sVar18;
      }
      bVar37 = dstCapacity < sVar18;
      dstCapacity = dstCapacity - sVar18;
      if (bVar37) {
        __assert_fail("fhSize <= dstCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x62a6,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      dst = (void *)((long)dst + sVar18);
      cctx->stage = ZSTDcs_ongoing;
    }
    else {
      sVar18 = 0;
    }
    if (srcSize == 0) {
      return sVar18;
    }
    pBVar29 = (cctx->blockState).matchState.window.base;
    if (pBVar29 == (BYTE *)0x0) {
LAB_00184c89:
      __assert_fail("window->base != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x48d8,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    if ((cctx->blockState).matchState.window.dictBase == (BYTE *)0x0) {
LAB_00184ca8:
      __assert_fail("window->dictBase != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x48d9,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    ms = &(cctx->blockState).matchState;
    pBVar8 = (ms->window).nextSrc;
    bVar37 = (cctx->blockState).matchState.forceNonContiguous != 0;
    if (bVar37 || pBVar8 != (BYTE *)src) {
      uVar27 = (long)pBVar8 - (long)pBVar29;
      UVar5 = (cctx->blockState).matchState.window.dictLimit;
      (cctx->blockState).matchState.window.lowLimit = UVar5;
      if (uVar27 >> 0x20 != 0) goto LAB_00184ce6;
      UVar15 = (U32)uVar27;
      (cctx->blockState).matchState.window.dictLimit = UVar15;
      (cctx->blockState).matchState.window.dictBase = pBVar29;
      (cctx->blockState).matchState.window.base = (BYTE *)((long)src - uVar27);
      if (UVar15 - UVar5 < 8) {
        (cctx->blockState).matchState.window.lowLimit = UVar15;
      }
    }
    pBVar29 = (BYTE *)((long)src + srcSize);
    (cctx->blockState).matchState.window.nextSrc = pBVar29;
    pBVar9 = (cctx->blockState).matchState.window.dictBase;
    uVar24 = (cctx->blockState).matchState.window.dictLimit;
    if (src < pBVar9 + uVar24 && pBVar9 + (cctx->blockState).matchState.window.lowLimit < pBVar29) {
      uVar25 = (uint)((long)pBVar29 - (long)pBVar9);
      if ((long)(ulong)uVar24 < (long)pBVar29 - (long)pBVar9) {
        uVar25 = uVar24;
      }
      (cctx->blockState).matchState.window.lowLimit = uVar25;
    }
    if (bVar37 || pBVar8 != (BYTE *)src) {
      (cctx->blockState).matchState.forceNonContiguous = 0;
      (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
    }
    local_48 = sVar18;
    if ((cctx->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      pBVar8 = (cctx->ldmState).window.base;
      if (pBVar8 == (BYTE *)0x0) goto LAB_00184c89;
      if ((cctx->ldmState).window.dictBase == (BYTE *)0x0) goto LAB_00184ca8;
      pBVar9 = (cctx->ldmState).window.nextSrc;
      if (pBVar9 != (BYTE *)src) {
        uVar27 = (long)pBVar9 - (long)pBVar8;
        UVar5 = (cctx->ldmState).window.dictLimit;
        (cctx->ldmState).window.lowLimit = UVar5;
        if (uVar27 >> 0x20 != 0) {
LAB_00184ce6:
          __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x48e0,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)"
                       );
        }
        UVar15 = (U32)uVar27;
        (cctx->ldmState).window.dictLimit = UVar15;
        (cctx->ldmState).window.dictBase = pBVar8;
        (cctx->ldmState).window.base = (BYTE *)((long)src - uVar27);
        if (UVar15 - UVar5 < 8) {
          (cctx->ldmState).window.lowLimit = UVar15;
        }
      }
      (cctx->ldmState).window.nextSrc = pBVar29;
      pBVar8 = (cctx->ldmState).window.dictBase;
      uVar24 = (cctx->ldmState).window.dictLimit;
      if (src < pBVar8 + uVar24 && pBVar8 + (cctx->ldmState).window.lowLimit < pBVar29) {
        uVar25 = (uint)((long)pBVar29 - (long)pBVar8);
        if ((long)(ulong)uVar24 < (long)pBVar29 - (long)pBVar8) {
          uVar25 = uVar24;
        }
        (cctx->ldmState).window.lowLimit = uVar25;
      }
    }
    if (frame == 0) {
      ZSTD_overflowCorrectIfNeeded(ms,&cctx->workspace,&cctx->appliedParams,src,pBVar29);
      local_110 = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize,0);
    }
    else {
      uVar24 = (cctx->appliedParams).cParams.windowLog;
      iVar16 = 1 << ((byte)uVar24 & 0x1f);
      if (0x1f < uVar24) {
        __assert_fail("cctx->appliedParams.cParams.windowLog <= ZSTD_WINDOWLOG_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x61ec,
                      "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                     );
      }
      local_120 = cctx->blockSize;
      if ((cctx->appliedParams).fParams.checksumFlag != 0) {
        XXH_INLINE_XXH64_update(&cctx->xxhState,src,srcSize);
      }
      local_40 = &cctx->workspace;
      origSeqStore = &cctx->seqStore;
      pUVar1 = (cctx->blockSplitCtx).partitions;
      resultSeqStore = &(cctx->blockSplitCtx).nextSeqStore;
      resultSeqStore_00 = &(cctx->blockSplitCtx).currSeqStore;
      sVar18 = srcSize;
      op = (BYTE *)dst;
      do {
        if (sVar18 == 0) {
          if ((lastFrameChunk != 0) && (dst < op)) {
            cctx->stage = ZSTDcs_ending;
          }
          local_110 = (long)op - (long)dst;
          break;
        }
        uVar25 = 0;
        uVar24 = lastFrameChunk & 1;
        if (local_120 < sVar18) {
          uVar24 = uVar25;
        }
        if (dstCapacity < 6) {
          local_110 = 0xffffffffffffffba;
        }
        else {
          if (sVar18 < local_120) {
            local_120 = sVar18;
          }
          pBVar29 = (BYTE *)((long)src + local_120);
          ZSTD_overflowCorrectIfNeeded(ms,local_40,&cctx->appliedParams,src,pBVar29);
          iVar17 = (int)(cctx->blockState).matchState.window.base;
          uVar26 = (int)pBVar29 - iVar17;
          uVar25 = (cctx->blockState).matchState.loadedDictEnd;
          local_38 = pBVar29;
          if (uVar26 < uVar25) {
            __assert_fail("blockEndIdx >= loadedDictEnd",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x48a8,
                          "void ZSTD_checkDictValidity(const ZSTD_window_t *, const void *, U32, U32 *, const ZSTD_matchState_t **)"
                         );
          }
          if ((iVar16 + uVar25 < uVar26) ||
             (uVar25 != (cctx->blockState).matchState.window.dictLimit)) {
            (cctx->blockState).matchState.loadedDictEnd = 0;
            (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
          }
          uVar25 = (int)src - iVar17;
          if ((cctx->blockState).matchState.loadedDictEnd + iVar16 < uVar25) {
            uVar25 = uVar25 - iVar16;
            if ((cctx->blockState).matchState.window.lowLimit < uVar25) {
              (cctx->blockState).matchState.window.lowLimit = uVar25;
            }
            uVar25 = (cctx->blockState).matchState.window.lowLimit;
            if ((cctx->blockState).matchState.window.dictLimit < uVar25) {
              (cctx->blockState).matchState.window.dictLimit = uVar25;
            }
            (cctx->blockState).matchState.loadedDictEnd = 0;
            (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
          }
          uVar25 = (cctx->blockState).matchState.window.lowLimit;
          if ((cctx->blockState).matchState.nextToUpdate < uVar25) {
            (cctx->blockState).matchState.nextToUpdate = uVar25;
          }
          uVar12 = (ushort)uVar24;
          sVar23 = (short)local_120;
          if ((cctx->appliedParams).targetCBlockSize == 0) {
            ZVar6 = (cctx->appliedParams).useBlockSplitter;
            if (ZVar6 == ZSTD_ps_enable) {
              uVar27 = ZSTD_buildSeqStore(cctx,src,local_120);
              if (uVar27 < 0xffffffffffffff89) {
                if (uVar27 == 1) {
                  pZVar10 = (cctx->blockState).prevCBlock;
                  if ((pZVar10->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
                    (pZVar10->entropy).fse.offcode_repeatMode = FSE_repeat_check;
                  }
                  uVar27 = local_120 + 3;
                  if (dstCapacity < uVar27) {
                    uVar27 = 0xffffffffffffffba;
                  }
                  else {
                    *(ushort *)op = uVar12 + sVar23 * 8;
                    op[2] = (BYTE)(local_120 >> 0xd);
                    memcpy(op + 3,src,local_120);
                  }
                  goto LAB_001847ac;
                }
                pBVar29 = (BYTE *)((ulong)((long)(cctx->seqStore).sequences -
                                          (long)(cctx->seqStore).sequencesStart) >> 3);
                bVar37 = true;
              }
              else {
LAB_001847ac:
                bVar37 = false;
              }
              if (bVar37) {
                stack0xffffffffffffff18 = 0;
                if (4 < (uint)pBVar29) {
                  dRep.rep._0_8_ = pUVar1;
                  ZSTD_deriveBlockSplitsHelper
                            ((seqStoreSplits *)&dRep,0,(ulong)pBVar29 & 0xffffffff,cctx,origSeqStore
                            );
                  *(uint *)(dRep.rep._0_8_ + stack0xffffffffffffff18 * 4) = (uint)pBVar29;
                }
                uVar13 = stack0xffffffffffffff18;
                pZVar10 = (cctx->blockState).prevCBlock;
                stack0xffffffffffffff18 = CONCAT44(uStack_e4,pZVar10->rep[2]);
                dRep.rep._0_8_ = *(undefined8 *)pZVar10->rep;
                local_58.rep._0_8_ = *(undefined8 *)pZVar10->rep;
                local_58.rep[2] = pZVar10->rep[2];
                (cctx->blockSplitCtx).nextSeqStore.maxNbLit = 0;
                (cctx->blockSplitCtx).nextSeqStore.longLengthType = ZSTD_llt_none;
                (cctx->blockSplitCtx).nextSeqStore.longLengthPos = 0;
                (cctx->blockSplitCtx).nextSeqStore.ofCode = (BYTE *)0x0;
                (cctx->blockSplitCtx).nextSeqStore.maxNbSeq = 0;
                (cctx->blockSplitCtx).nextSeqStore.llCode = (BYTE *)0x0;
                (cctx->blockSplitCtx).nextSeqStore.mlCode = (BYTE *)0x0;
                (cctx->blockSplitCtx).nextSeqStore.litStart = (BYTE *)0x0;
                (cctx->blockSplitCtx).nextSeqStore.lit = (BYTE *)0x0;
                resultSeqStore->sequencesStart = (seqDef *)0x0;
                resultSeqStore->sequences = (seqDef *)0x0;
                if (uVar13 == 0) {
                  uVar27 = ZSTD_compressSeqStore_singleBlock
                                     (cctx,origSeqStore,&dRep,&local_58,op,dstCapacity,src,local_120
                                      ,uVar24,0);
                  if (uVar27 < 0xffffffffffffff89) {
                    if (0x20000 < cctx->blockSize) {
                      __assert_fail("zc->blockSize <= ZSTD_BLOCKSIZE_MAX",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x60ed,
                                    "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                                   );
                    }
                    if (cctx->blockSize + 3 < uVar27) {
                      __assert_fail("cSizeSingleBlock <= zc->blockSize + ZSTD_blockHeaderSize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x60ee,
                                    "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                                   );
                    }
                  }
                }
                else {
                  ZSTD_deriveSeqStoreChunk(resultSeqStore_00,origSeqStore,0,(ulong)*pUVar1);
                  uVar36 = 0;
                  local_78 = op;
                  uVar30 = 0;
                  local_60 = 0;
                  uVar27 = sVar18;
                  local_70 = (BYTE *)src;
                  local_68 = dstCapacity;
                  do {
                    sVar19 = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore_00);
                    psVar11 = (cctx->blockSplitCtx).currSeqStore.sequencesStart;
                    lVar28 = (long)(cctx->blockSplitCtx).currSeqStore.sequences - (long)psVar11;
                    if (lVar28 == 0) {
                      lVar35 = 0;
                    }
                    else {
                      lVar28 = lVar28 >> 3;
                      lVar35 = 0;
                      uVar32 = 0;
                      do {
                        lVar34 = lVar35 + (ulong)psVar11[uVar32].mlBase;
                        lVar35 = lVar34 + 3;
                        if (((cctx->blockSplitCtx).currSeqStore.longLengthPos == uVar32) &&
                           ((cctx->blockSplitCtx).currSeqStore.longLengthType ==
                            ZSTD_llt_matchLength)) {
                          lVar35 = lVar34 + 0x10003;
                        }
                        uVar32 = uVar32 + 1;
                      } while (lVar28 + (ulong)(lVar28 == 0) != uVar32);
                    }
                    sVar19 = lVar35 + sVar19;
                    local_60 = local_60 + sVar19;
                    if (uVar30 == uVar13) {
                      sVar19 = (sVar19 + local_120) - local_60;
                      uVar25 = uVar24;
                    }
                    else {
                      ZSTD_deriveSeqStoreChunk
                                (resultSeqStore,origSeqStore,(ulong)pUVar1[uVar30],
                                 (ulong)(cctx->blockSplitCtx).partitions[uVar30 + 1]);
                      uVar25 = 0;
                    }
                    sVar20 = ZSTD_compressSeqStore_singleBlock
                                       (cctx,resultSeqStore_00,&dRep,&local_58,local_78,local_68,
                                        local_70,sVar19,uVar25,1);
                    sVar14 = sVar20;
                    if (sVar20 < 0xffffffffffffff89) {
                      psVar31 = resultSeqStore;
                      psVar33 = resultSeqStore_00;
                      for (lVar28 = 10; lVar28 != 0; lVar28 = lVar28 + -1) {
                        psVar33->sequencesStart = psVar31->sequencesStart;
                        psVar31 = (seqStore_t *)((long)psVar31 + (ulong)bVar38 * -0x10 + 8);
                        psVar33 = (seqStore_t *)((long)psVar33 + (ulong)bVar38 * -0x10 + 8);
                      }
                      if (cctx->blockSize + 3 < sVar20) {
                        __assert_fail("cSizeChunk <= zc->blockSize + ZSTD_blockHeaderSize",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0x6110,
                                      "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                                     );
                      }
                      uVar36 = uVar36 + sVar20;
                      local_68 = local_68 - sVar20;
                      local_78 = local_78 + sVar20;
                      local_70 = local_70 + sVar19;
                      sVar14 = uVar27;
                    }
                    uVar27 = sVar14;
                    if (0xffffffffffffff88 < sVar20) goto LAB_00184a97;
                    uVar30 = uVar30 + 1;
                  } while (uVar30 <= uVar13);
                  pZVar10 = (cctx->blockState).prevCBlock;
                  pZVar10->rep[2] = dRep.rep[2];
                  *(undefined8 *)pZVar10->rep = dRep.rep._0_8_;
                  uVar27 = uVar36;
                }
              }
LAB_00184a97:
              if (uVar27 < 0xffffffffffffff89) {
                if (uVar27 == 0) {
                  if ((cctx->seqCollector).collectSequences != 1) {
                    __assert_fail("cSize > 0 || cctx->seqCollector.collectSequences == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x620e,
                                  "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                                 );
                  }
                  uVar27 = 0;
                }
                goto LAB_00184ac6;
              }
            }
            else {
              if (ZVar6 == ZSTD_ps_auto) {
                __assert_fail("cctxParams->useBlockSplitter != ZSTD_ps_auto",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x5b33,"int ZSTD_blockSplitterEnabled(ZSTD_CCtx_params *)");
              }
              uVar27 = ZSTD_compressBlock_internal(cctx,op + 3,dstCapacity - 3,src,local_120,1);
              if (uVar27 < 0xffffffffffffff89) {
                if (uVar27 == 1) {
                  sVar23 = 2;
                  sVar19 = local_120;
                }
                else {
                  if (uVar27 == 0) {
                    uVar27 = 0xffffffffffffffba;
                    if (local_120 + 3 <= dstCapacity) {
                      *(ushort *)op = uVar12 + sVar23 * 8;
                      op[2] = (BYTE)(local_120 >> 0xd);
                      memcpy(op + 3,src,local_120);
                      uVar27 = local_120 + 3;
                    }
                    if (0xffffffffffffff88 < uVar27) goto LAB_00184af0;
                    goto LAB_00184ac6;
                  }
                  sVar23 = 4;
                  sVar19 = uVar27;
                }
                *(ushort *)op = sVar23 + (short)sVar19 * 8 | uVar12;
                op[2] = (BYTE)(sVar19 >> 0xd);
                uVar27 = uVar27 + 3;
                goto LAB_00184ac6;
              }
            }
LAB_00184af0:
            local_110 = uVar27;
            uVar25 = 0;
          }
          else {
            uVar27 = ZSTD_buildSeqStore(cctx,src,local_120);
            if (uVar27 < 0xffffffffffffff89) {
              if (uVar27 == 0) {
                if ((((cctx->isFirstBlock == 0) &&
                     ((ulong)((long)(cctx->seqStore).sequences -
                             (long)(cctx->seqStore).sequencesStart) < 0x20)) &&
                    ((ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart) < 10)) &&
                   (iVar17 = ZSTD_isRLE((BYTE *)src,local_120), iVar17 != 0)) {
                  BVar4 = *src;
                  *(ushort *)op = uVar12 + sVar23 * 8 + 2;
                  op[2] = (BYTE)(local_120 >> 0xd);
                  op[3] = BVar4;
                  uVar27 = 4;
                }
                else {
                  uVar27 = ZSTD_compressSuperBlock(cctx,op,dstCapacity,src,local_120,uVar24);
                  if (uVar27 == 0xffffffffffffffba) goto LAB_00184463;
                  ZVar7 = (cctx->appliedParams).cParams.strategy;
                  if (ZVar7 + ~ZSTD_btultra2 < 0xfffffff7) {
                    __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_strategy, (int)strat)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x4646,"size_t ZSTD_minGain(size_t, ZSTD_strategy)");
                  }
                  if (uVar27 < 0xffffffffffffff89) {
                    bVar22 = (char)ZVar7 - 1;
                    if (ZVar7 < ZSTD_btultra) {
                      bVar22 = 6;
                    }
                    if ((uVar27 == 0) ||
                       ((local_120 - (local_120 >> (bVar22 & 0x3f))) + 1 <= uVar27))
                    goto LAB_00184463;
                    uVar2 = (cctx->blockState).prevCBlock;
                    uVar3 = (cctx->blockState).nextCBlock;
                    auVar39._8_4_ = (int)uVar2;
                    auVar39._0_8_ = uVar3;
                    auVar39._12_4_ = (int)((ulong)uVar2 >> 0x20);
                    (cctx->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
                    (cctx->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar39._8_8_;
                  }
                }
              }
              else {
LAB_00184463:
                uVar27 = 0xffffffffffffffba;
                if (local_120 + 3 <= dstCapacity) {
                  *(ushort *)op = uVar12 + sVar23 * 8;
                  op[2] = (BYTE)(local_120 >> 0xd);
                  memcpy(op + 3,src,local_120);
                  uVar27 = local_120 + 3;
                }
              }
              if ((uVar27 < 0xffffffffffffff89) &&
                 (pZVar10 = (cctx->blockState).prevCBlock,
                 (pZVar10->entropy).fse.offcode_repeatMode == FSE_repeat_valid)) {
                (pZVar10->entropy).fse.offcode_repeatMode = FSE_repeat_check;
              }
            }
            if (0xffffffffffffff88 < uVar27) {
              uVar25 = 0;
              local_110 = uVar27;
              goto LAB_00184afc;
            }
            if (uVar27 == 0) {
              __assert_fail("cSize > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x6209,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
            if (local_120 + 3 < uVar27) {
              __assert_fail("cSize <= blockSize + ZSTD_blockHeaderSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x620a,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
LAB_00184ac6:
            bVar37 = dstCapacity < uVar27;
            dstCapacity = dstCapacity - uVar27;
            if (bVar37) {
              __assert_fail("dstCapacity >= cSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x6226,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
            op = op + uVar27;
            sVar18 = sVar18 - local_120;
            cctx->isFirstBlock = 0;
            uVar25 = 1;
            src = local_38;
          }
        }
LAB_00184afc:
      } while ((char)uVar25 != '\0');
    }
    if (local_110 < 0xffffffffffffff89) {
      uVar21 = srcSize + cctx->consumedSrcSize;
      cctx->consumedSrcSize = uVar21;
      sVar18 = local_110 + local_48;
      cctx->producedCSize = cctx->producedCSize + sVar18;
      if (((cctx->appliedParams).fParams.contentSizeFlag != 0) && (cctx->pledgedSrcSizePlusOne == 0)
         ) {
        __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x62c4,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      local_110 = 0xffffffffffffffb8;
      if (uVar21 + 1 <= cctx->pledgedSrcSizePlusOne) {
        local_110 = sVar18;
      }
      if (cctx->pledgedSrcSizePlusOne == 0) {
        local_110 = sVar18;
      }
    }
  }
  return local_110;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize, "ZSTD_writeFrameHeader failed");
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize, ms->forceNonContiguous)) {
        ms->forceNonContiguous = 0;
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize, /* forceNonContiguous */ 0);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize, "%s", frame ? "ZSTD_compress_frameChunk failed" : "ZSTD_compressBlock_internal failed");
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}